

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int parseAndSaveValueTree
              (string *input,string *actual,string *kind,Features *features,bool parseOnly,
              Value *root)

{
  pointer pcVar1;
  bool bVar2;
  FILE *__stream;
  int iVar3;
  Reader reader;
  string local_160;
  Reader local_140;
  
  Json::Reader::Reader(&local_140,features);
  bVar2 = Json::Reader::parse(&local_140,input,root,true);
  if (bVar2) {
    iVar3 = 0;
    if (!parseOnly) {
      __stream = fopen((actual->_M_dataplus)._M_p,"wt");
      if (__stream == (FILE *)0x0) {
        printf("Failed to create %s actual file.\n",(kind->_M_dataplus)._M_p);
        iVar3 = 2;
      }
      else {
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,".","");
        printValueTree((FILE *)__stream,root,&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p);
        }
        fclose(__stream);
        iVar3 = 0;
      }
    }
  }
  else {
    pcVar1 = (kind->_M_dataplus)._M_p;
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_160,&local_140);
    printf("Failed to parse %s file: \n%s\n",pcVar1,local_160._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    iVar3 = 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  return iVar3;
}

Assistant:

static int parseAndSaveValueTree(const std::string& input,
                                 const std::string& actual,
                                 const std::string& kind,
                                 const Json::Features& features,
                                 bool parseOnly,
                                 Json::Value* root)
{
  Json::Reader reader(features);
  bool parsingSuccessful = reader.parse(input, *root);
  if (!parsingSuccessful) {
    printf("Failed to parse %s file: \n%s\n",
           kind.c_str(),
           reader.getFormattedErrorMessages().c_str());
    return 1;
  }
  if (!parseOnly) {
    FILE* factual = fopen(actual.c_str(), "wt");
    if (!factual) {
      printf("Failed to create %s actual file.\n", kind.c_str());
      return 2;
    }
    printValueTree(factual, *root);
    fclose(factual);
  }
  return 0;
}